

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O2

void __thiscall roaring::Roaring::Roaring(Roaring *this,Roaring *r)

{
  container_s **ppcVar1;
  uint8_t *puVar2;
  undefined7 uVar3;
  int32_t iVar4;
  int32_t iVar5;
  
  uVar3 = *(undefined7 *)&(r->roaring).high_low_container.field_0x21;
  (this->roaring).high_low_container.flags = (r->roaring).high_low_container.flags;
  *(undefined7 *)&(this->roaring).high_low_container.field_0x21 = uVar3;
  iVar4 = (r->roaring).high_low_container.size;
  iVar5 = (r->roaring).high_low_container.allocation_size;
  ppcVar1 = (r->roaring).high_low_container.containers;
  puVar2 = (r->roaring).high_low_container.typecodes;
  (this->roaring).high_low_container.keys = (r->roaring).high_low_container.keys;
  (this->roaring).high_low_container.typecodes = puVar2;
  (this->roaring).high_low_container.size = iVar4;
  (this->roaring).high_low_container.allocation_size = iVar5;
  (this->roaring).high_low_container.containers = ppcVar1;
  roaring_bitmap_init_cleared((roaring_bitmap_t *)r);
  return;
}

Assistant:

Roaring(Roaring &&r) noexcept : roaring(r.roaring) {
        //
        // !!! This clones the bits of the roaring structure to a new location
        // and then overwrites the old bits...assuming that this will still
        // work.  There are scenarios where this could break; e.g. if some of
        // those bits were pointers into the structure memory itself.  If such
        // things were possible, a roaring_bitmap_move() API would be needed.
        //
        api::roaring_bitmap_init_cleared(&r.roaring);
    }